

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_>_>_>,_bool>
 __thiscall
itlib::
flat_map<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>>>>
::
insert<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>>
          (flat_map<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>>>>
           *this,pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>
                 *val)

{
  bool bVar1;
  iterator __position;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_>_>_>,_bool>
  pVar3;
  
  __position._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>
        *)lower_bound<std::__cxx11::string>(this,&val->first);
  if (__position._M_current !=
      *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>
        **)(this + 8)) {
    bVar1 = std::operator<(&val->first,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __position._M_current);
    if (!bVar1) {
      uVar2 = 0;
      goto LAB_0026c423;
    }
  }
  __position = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_>_>
               ::_M_insert_rval((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_>_>
                                 *)this,(const_iterator)__position._M_current,val);
  uVar2 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_0026c423:
  pVar3._8_8_ = uVar2;
  pVar3.first._M_current = __position._M_current;
  return pVar3;
}

Assistant:

std::pair<iterator, bool> insert(P&& val)
    {
        auto i = lower_bound(val.first);
        if (i != end() && !cmp()(val.first, *i))
        {
            return { i, false };
        }

        return{ m_container.emplace(i, std::forward<P>(val)), true };
    }